

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<double>::CheckTypeCompatibility
          (TPZSkylMatrix<double> *this,TPZMatrix<double> *A,TPZMatrix<double> *B)

{
  bool bVar1;
  long column;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  TPZSkylMatrix<double> *in_RDX;
  long in_RSI;
  bool bVar5;
  int i;
  int64_t ncols;
  bool check;
  TPZSkylMatrix<double> *bPtr;
  TPZSkylMatrix<double> *aPtr;
  anon_class_1_0_00000001 incompatSkyline;
  TPZBaseMatrix *local_58;
  int local_44;
  
  if (in_RSI == 0) {
    local_58 = (TPZBaseMatrix *)0x0;
  }
  else {
    local_58 = (TPZBaseMatrix *)__dynamic_cast(in_RSI,&TPZMatrix<double>::typeinfo,&typeinfo,0);
  }
  if (in_RDX == (TPZSkylMatrix<double> *)0x0) {
    column = 0;
  }
  else {
    column = __dynamic_cast(in_RDX,&TPZMatrix<double>::typeinfo,&typeinfo,0);
  }
  if ((local_58 == (TPZBaseMatrix *)0x0) || (column == 0)) {
    CheckTypeCompatibility::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)0x1377af9);
  }
  bVar5 = false;
  iVar2 = TPZBaseMatrix::Cols(local_58);
  for (local_44 = 0; local_44 < iVar2; local_44 = local_44 + 1) {
    bVar1 = !bVar5;
    bVar5 = true;
    if (bVar1) {
      iVar3 = Size(in_RDX,column);
      iVar4 = Size(in_RDX,column);
      bVar5 = iVar3 != iVar4;
    }
  }
  if (bVar5) {
    CheckTypeCompatibility::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)0x1377b89);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::CheckTypeCompatibility(const TPZMatrix<TVar>*A,
                                                 const TPZMatrix<TVar>*B)const
{
  auto incompatSkyline = [](){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"\nERROR: incompatible matrices\n.Aborting...\n";
    DebugStop();
  };
  auto aPtr = dynamic_cast<const TPZSkylMatrix<TVar>*>(A);
  auto bPtr = dynamic_cast<const TPZSkylMatrix<TVar>*>(B);
  if(!aPtr || !bPtr){
    incompatSkyline();
  }

  bool check{false};
  auto ncols = aPtr->Cols();
  for(auto i = 0; i < ncols; i++){
    check = check || aPtr->Size(i) != bPtr->Size(i);
  }
  if(check) incompatSkyline();
}